

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O3

void __thiscall wasm::WasmBinaryReader::readFunctions(WasmBinaryReader *this)

{
  int iVar1;
  size_t sVar2;
  size_t currLocation;
  pointer puVar3;
  __uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true> _Var4;
  Module *pMVar5;
  uint32_t uVar6;
  undefined1 *puVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  uint uVar12;
  string local_160;
  string local_140;
  undefined1 local_120 [8];
  Result<wasm::Ok> inst;
  undefined1 local_e8 [16];
  string local_d8;
  string local_b8;
  string local_98;
  undefined1 auStack_78 [8];
  Result<wasm::Ok> start;
  int local_40;
  
  uVar6 = getU32LEB(this);
  this->numFuncBodies = uVar6;
  if ((long)(this->wasm->functions).
            super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(this->wasm->functions).
            super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start >> 3 != (ulong)(this->numFuncImports + uVar6))
  {
    local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_160,"invalid function section size, must equal types","");
    throwError(this,&local_160);
  }
  if (this->DWARF == true) {
    sVar2 = this->codeSectionLocation;
    (this->builder).binaryPos = &this->pos;
    (this->builder).codeSectionOffset = sVar2;
  }
  if (uVar6 != 0) {
    start.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>
    .super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
    super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>.
    _32_8_ = &this->sourceMapReader;
    uVar11 = 0;
    do {
      sVar2 = this->pos;
      uVar6 = getU32LEB(this);
      if (uVar6 == 0) {
        local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_140,"empty function size","");
        throwError(this,&local_140);
      }
      currLocation = this->pos;
      uVar8 = (ulong)this->numFuncImports;
      puVar3 = (this->wasm->functions).
               super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      _Var4.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
      super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
      super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
           puVar3[uVar11 + uVar8]._M_t.
           super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>;
      this->currFunction =
           (Function *)
           _Var4.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
           super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
      iVar9 = (int)currLocation;
      if (this->DWARF == true) {
        iVar1 = (int)this->codeSectionLocation;
        iVar10 = iVar9 - iVar1;
        *(int *)((long)_Var4.
                       super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                       .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x1b0) =
             (int)sVar2 - iVar1;
        *(int *)((long)_Var4.
                       super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                       .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x1b4) =
             iVar10;
        *(uint32_t *)
         ((long)_Var4.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                _M_t.super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x1b8) =
             uVar6 + iVar10;
      }
      uVar12 = uVar6 + iVar9;
      SourceMapReader::readDebugLocationAt
                ((optional<wasm::Function::DebugLocation> *)auStack_78,
                 (SourceMapReader *)
                 start.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_,currLocation);
      _Var4.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
      super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
      super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
           puVar3[uVar11 + uVar8]._M_t.
           super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>;
      *(undefined8 *)
       ((long)_Var4.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t
              .super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
              super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x120) =
           start.val.super__Variant_base<wasm::Ok,_wasm::Err>.
           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>
           .super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
           super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_8_;
      *(undefined1 (*) [8])
       ((long)_Var4.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t
              .super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
              super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x110) = auStack_78;
      *(undefined8 *)
       ((long)_Var4.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t
              .super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
              super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x118) =
           start.val.super__Variant_base<wasm::Ok,_wasm::Err>.
           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>
           .super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
           super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_;
      readVars(this);
      local_40 = (int)uVar11;
      setLocalNames(this,(Function *)
                         puVar3[uVar11 + uVar8]._M_t.
                         super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                    ,this->numFuncImports + local_40);
      if ((this->skipFunctionBodies == true) &&
         (pMVar5 = this->wasm,
         (long)(pMVar5->functions).
               super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)(pMVar5->functions).
               super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start >> 3 != (ulong)this->startIndex)) {
        puVar7 = (undefined1 *)MixedArena::allocSpace(&pMVar5->allocator,0x10,8);
        *puVar7 = 0x17;
        *(undefined8 *)(puVar7 + 8) = 1;
        *(undefined1 **)
         ((long)puVar3[uVar11 + uVar8]._M_t.
                super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_> + 0x60)
             = puVar7;
        this->pos = (ulong)uVar12;
      }
      else {
        IRBuilder::visitFunctionStart
                  ((Result<wasm::Ok> *)auStack_78,&this->builder,
                   (Function *)
                   puVar3[uVar11 + uVar8]._M_t.
                   super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>);
        if (start.val.super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
          inst.val.super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_ = local_e8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)
                     ((long)&inst.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),auStack_78,
                     start.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_ + (long)auStack_78
                    );
          throwError(this,(string *)
                          ((long)&inst.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                  super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                  super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                  super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
        }
        while (this->pos < (ulong)uVar12) {
          readInst((Result<wasm::Ok> *)local_120,this);
          if (inst.val.super__Variant_base<wasm::Ok,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
            local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_d8,local_120,
                       inst.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_ +
                       (long)local_120);
            throwError(this,&local_d8);
          }
          std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                    ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_120);
        }
        if (this->pos != (ulong)uVar12) {
          local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_b8,"function overflowed its bounds","");
          throwError(this,&local_b8);
        }
        if ((this->builder).scopeStack.
            super__Vector_base<wasm::IRBuilder::ScopeCtx,_std::allocator<wasm::IRBuilder::ScopeCtx>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (this->builder).scopeStack.
            super__Vector_base<wasm::IRBuilder::ScopeCtx,_std::allocator<wasm::IRBuilder::ScopeCtx>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_98,"expected function end","");
          throwError(this,&local_98);
        }
        std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)auStack_78);
      }
      (this->sourceMapReader).hasInfo = false;
      TypeUpdating::handleNonDefaultableLocals
                ((Function *)
                 puVar3[uVar11 + uVar8]._M_t.
                 super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>,
                 this->wasm);
      this->currFunction = (Function *)0x0;
      uVar11 = uVar11 + 1;
    } while (uVar11 < this->numFuncBodies);
  }
  return;
}

Assistant:

void WasmBinaryReader::readFunctions() {
  numFuncBodies = getU32LEB();
  if (numFuncBodies + numFuncImports != wasm.functions.size()) {
    throwError("invalid function section size, must equal types");
  }
  if (DWARF) {
    builder.setBinaryLocation(&pos, codeSectionLocation);
  }
  for (size_t i = 0; i < numFuncBodies; i++) {
    auto sizePos = pos;
    size_t size = getU32LEB();
    if (size == 0) {
      throwError("empty function size");
    }
    Index endOfFunction = pos + size;

    auto& func = wasm.functions[numFuncImports + i];
    currFunction = func.get();

    if (DWARF) {
      func->funcLocation = BinaryLocations::FunctionLocations{
        BinaryLocation(sizePos - codeSectionLocation),
        BinaryLocation(pos - codeSectionLocation),
        BinaryLocation(pos - codeSectionLocation + size)};
    }

    func->prologLocation = sourceMapReader.readDebugLocationAt(pos);

    readVars();
    setLocalNames(*func, numFuncImports + i);
    {
      // Process the function body. Even if we are skipping function bodies we
      // need to not skip the start function. That contains important code for
      // wasm-emscripten-finalize in the form of pthread-related segment
      // initializations. As this is just one function, it doesn't add
      // significant time, so the optimization of skipping bodies is still very
      // useful.
      auto currFunctionIndex = wasm.functions.size();
      bool isStart = startIndex == currFunctionIndex;
      if (skipFunctionBodies && !isStart) {
        // When skipping the function body we need to put something valid in
        // their place so we validate. An unreachable is always acceptable
        // there.
        func->body = Builder(wasm).makeUnreachable();
        // Skip reading the contents.
        pos = endOfFunction;
      } else {
        auto start = builder.visitFunctionStart(func.get());
        if (auto* err = start.getErr()) {
          throwError(err->msg);
        }
        while (pos < endOfFunction) {
          auto inst = readInst();
          if (auto* err = inst.getErr()) {
            throwError(err->msg);
          }
        }
        if (pos != endOfFunction) {
          throwError("function overflowed its bounds");
        }
        if (!builder.empty()) {
          throwError("expected function end");
        }
      }
    }

    sourceMapReader.finishFunction();
    TypeUpdating::handleNonDefaultableLocals(func.get(), wasm);
    currFunction = nullptr;
  }
}